

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

Am_Connection * Am_Connection::Open(sockaddr *sa)

{
  uint __fd;
  int iVar1;
  Am_Connection *pAVar2;
  Am_Connection_Data *this;
  Connection_List_Ptr pcVar3;
  
  pAVar2 = (Am_Connection *)operator_new(8);
  Am_Connection(pAVar2);
  this = (Am_Connection_Data *)operator_new(0x48);
  Am_Connection_Data::Am_Connection_Data(this);
  pAVar2->data = this;
  pcVar3 = (Connection_List_Ptr)operator_new(0x10);
  pcVar3->connection_ptr = pAVar2;
  pcVar3->next = connection_list;
  num_sockets = num_sockets + 1;
  connection_list = pcVar3;
  __fd = socket(2,1,0);
  if ((int)__fd < 0) {
    perror("socket");
    pAVar2->data = (Am_Connection_Data *)0x0;
  }
  else {
    *(uint *)&(pAVar2->data->super_Am_Wrapper).field_0xc = __fd;
    socket_flags->fds_bits[__fd >> 6] =
         socket_flags->fds_bits[__fd >> 6] | 1L << ((byte)__fd & 0x3f);
    iVar1 = connect(__fd,(sockaddr *)sa,0x10);
    if (iVar1 < 0) {
      Delete_Connection(pAVar2);
      pAVar2 = Open();
      return pAVar2;
    }
    if (pAVar2->data != (Am_Connection_Data *)0x0) {
      pAVar2->data->connected = true;
    }
  }
  return pAVar2;
}

Assistant:

Am_Connection *
Am_Connection::Open(struct sockaddr *sa)
{
  /*
   * Variable initialization
   */
  Am_Connection *p_connection;
  p_connection = new Am_Connection;
  p_connection->data = new Am_Connection_Data;

  Add_Connection(p_connection);

  /* Allocate an open socket */
  int temp_socket;

  if ((temp_socket = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
    perror("socket");
    p_connection->Set_Valid_Flag(false);
  } else {
    p_connection->Set_Socket(temp_socket);
    /* Attempt to Connect to the remote server */
    if ((connect(p_connection->Get_Socket(), sa, sizeof(struct sockaddr))) >=
        0) {
      p_connection->Set_Connect_Flag(true);
    } else /* Go into passive mode */
    {
      //perror("connect");
      Delete_Connection(p_connection);
      p_connection = Open();
    }
  }
  return p_connection;
}